

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cgtAig.c
# Opt level: O0

Aig_Obj_t * Cgt_ManConstructCare_rec(Aig_Man_t *pCare,Aig_Obj_t *pObj,Aig_Man_t *pNew)

{
  int iVar1;
  Aig_Obj_t *pAVar2;
  Aig_Obj_t *pAVar3;
  Aig_Obj_t *pObj1;
  Aig_Obj_t *pObj0;
  Aig_Man_t *pNew_local;
  Aig_Obj_t *pObj_local;
  Aig_Man_t *pCare_local;
  
  iVar1 = Aig_ObjIsTravIdCurrent(pCare,pObj);
  if (iVar1 == 0) {
    Aig_ObjSetTravIdCurrent(pCare,pObj);
    iVar1 = Aig_ObjIsCi(pObj);
    if (iVar1 == 0) {
      pAVar2 = Aig_ObjFanin0(pObj);
      pAVar2 = Cgt_ManConstructCare_rec(pCare,pAVar2,pNew);
      if (pAVar2 == (Aig_Obj_t *)0x0) {
        (pObj->field_5).pData = (void *)0x0;
        pCare_local = (Aig_Man_t *)0x0;
      }
      else {
        pAVar3 = Aig_ObjFanin1(pObj);
        pAVar3 = Cgt_ManConstructCare_rec(pCare,pAVar3,pNew);
        if (pAVar3 == (Aig_Obj_t *)0x0) {
          (pObj->field_5).pData = (void *)0x0;
          pCare_local = (Aig_Man_t *)0x0;
        }
        else {
          iVar1 = Aig_ObjFaninC0(pObj);
          pAVar2 = Aig_NotCond(pAVar2,iVar1);
          iVar1 = Aig_ObjFaninC1(pObj);
          pAVar3 = Aig_NotCond(pAVar3,iVar1);
          pCare_local = (Aig_Man_t *)Aig_And(pNew,pAVar2,pAVar3);
          (pObj->field_5).pData = pCare_local;
        }
      }
    }
    else {
      (pObj->field_5).pData = (void *)0x0;
      pCare_local = (Aig_Man_t *)0x0;
    }
  }
  else {
    pCare_local = (Aig_Man_t *)(pObj->field_5).pData;
  }
  return (Aig_Obj_t *)pCare_local;
}

Assistant:

Aig_Obj_t * Cgt_ManConstructCare_rec( Aig_Man_t * pCare, Aig_Obj_t * pObj, Aig_Man_t * pNew )
{
    Aig_Obj_t * pObj0, * pObj1;
    if ( Aig_ObjIsTravIdCurrent( pCare, pObj ) )
        return (Aig_Obj_t *)pObj->pData;
    Aig_ObjSetTravIdCurrent( pCare, pObj );
    if ( Aig_ObjIsCi(pObj) )
        return (Aig_Obj_t *)(pObj->pData = NULL);
    pObj0 = Cgt_ManConstructCare_rec( pCare, Aig_ObjFanin0(pObj), pNew );
    if ( pObj0 == NULL )
        return (Aig_Obj_t *)(pObj->pData = NULL);
    pObj1 = Cgt_ManConstructCare_rec( pCare, Aig_ObjFanin1(pObj), pNew );
    if ( pObj1 == NULL )
        return (Aig_Obj_t *)(pObj->pData = NULL);
    pObj0 = Aig_NotCond( pObj0, Aig_ObjFaninC0(pObj) );
    pObj1 = Aig_NotCond( pObj1, Aig_ObjFaninC1(pObj) );
    return (Aig_Obj_t *)(pObj->pData = Aig_And( pNew, pObj0, pObj1 ));
}